

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

void __thiscall xr_entity_factory::xr_entity_factory(xr_entity_factory *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  (this->m_clsids).super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_clsids).super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_system_ini = (xr_ini_file *)0x0;
  (this->m_clsids).super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  init(this,in_RSI);
  return;
}

Assistant:

xr_entity_factory::xr_entity_factory(): m_system_ini(0)
{
	init();
}